

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix-fds.c
# Opt level: O0

int insert_wsi(lws_context *context,lws *wsi)

{
  uint uVar1;
  lws **pplVar2;
  int iVar3;
  bool bVar4;
  lws **done;
  lws **p;
  lws *wsi_local;
  lws_context *context_local;
  
  iVar3 = sanity_assert_no_wsi_traces(context,wsi);
  if (iVar3 == 0) {
    if ((*(ushort *)&context->field_0x7b7 >> 10 & 1) == 0) {
      if (context->lws_lookup[(wsi->desc).sockfd] != (lws *)0x0) {
        __assert_fail("context->lws_lookup[wsi->desc.sockfd - lws_plat_socket_offset()] == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/woodsts[P]libwebsockets/lib/plat/unix/unix-fds.c"
                      ,0x85,"int insert_wsi(const struct lws_context *, struct lws *)");
      }
      context->lws_lookup[(wsi->desc).sockfd] = wsi;
      context_local._4_4_ = 0;
    }
    else {
      pplVar2 = context->lws_lookup;
      uVar1 = context->max_fds;
      iVar3 = sanity_assert_no_sockfd_traces(context,(wsi->desc).sockfd);
      if (iVar3 == 0) {
        done = context->lws_lookup;
        while( true ) {
          bVar4 = false;
          if (done != pplVar2 + uVar1) {
            bVar4 = *done != (lws *)0x0;
          }
          if (!bVar4) break;
          done = done + 1;
        }
        if (done == pplVar2 + uVar1) {
          _lws_log(1,"%s: reached max fds\n","insert_wsi");
          context_local._4_4_ = 1;
        }
        else {
          *done = wsi;
          context_local._4_4_ = 0;
        }
      }
      else {
        context_local._4_4_ = 0;
      }
    }
  }
  else {
    context_local._4_4_ = 0;
  }
  return context_local._4_4_;
}

Assistant:

int
insert_wsi(const struct lws_context *context, struct lws *wsi)
{
	struct lws **p, **done;

	if (sanity_assert_no_wsi_traces(context, wsi))
		return 0;

	if (!context->max_fds_unrelated_to_ulimit) {
		assert(context->lws_lookup[wsi->desc.sockfd -
		                           lws_plat_socket_offset()] == 0);

		context->lws_lookup[wsi->desc.sockfd - \
				  lws_plat_socket_offset()] = wsi;

		return 0;
	}

	/* slow fds handling */

	p = context->lws_lookup;
	done = &p[context->max_fds];

	/* confirm fd isn't already in use by a wsi */

	if (sanity_assert_no_sockfd_traces(context, wsi->desc.sockfd))
		return 0;

	p = context->lws_lookup;

	/* find an empty slot */

	while (p != done && *p)
		p++;

	if (p == done) {
		lwsl_err("%s: reached max fds\n", __func__);
		return 1;
	}

	*p = wsi;

	return 0;
}